

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryReader::readGlobals(WasmBinaryReader *this)

{
  char *pcVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Expression *pEVar4;
  char *pcVar5;
  _Hash_node_base *p_Var6;
  size_t sVar7;
  Name NVar8;
  Name name;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_stack_ffffffffffffff08;
  undefined1 local_f0 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  __node_base local_a8 [2];
  uintptr_t local_98;
  size_t local_90;
  wasm *local_88;
  string local_80;
  pair<wasm::Name,_bool> local_60;
  char *local_48;
  ulong local_40;
  _Head_base<0UL,_wasm::Global_*,_false> local_38;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> global;
  
  uVar2 = getU32LEB(this);
  local_40 = (ulong)uVar2;
  pcVar5 = (char *)((long)(this->wasm->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->wasm->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_f0 = (undefined1  [8])&usedNames._M_h._M_rehash_policy._M_next_resize;
  usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedNames._M_h._M_bucket_count = 0;
  usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedNames._M_h._M_rehash_policy._4_4_ = 0;
  usedNames._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var6 = (this->globalNames)._M_h._M_before_begin._M_nxt;
  local_48 = pcVar5;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    pcVar1 = pcVar5 + local_40;
    do {
      if (pcVar1 <= (char *)(ulong)*(uint *)&p_Var6[1]._M_nxt) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning: global index out of bounds in name section: ",
                   0x35);
        NVar8.super_IString.str._M_str = pcVar5;
        NVar8.super_IString.str._M_len = (size_t)p_Var6[3]._M_nxt;
        poVar3 = wasm::operator<<((wasm *)&std::cerr,(ostream *)p_Var6[2]._M_nxt,NVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," at index ",10);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        local_60.first.super_IString.str._M_len =
             CONCAT71(local_60.first.super_IString.str._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_60,1);
      }
      local_60.first.super_IString.str._M_len = (size_t)local_f0;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_f0,p_Var6 + 2,&local_60);
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  if (local_40 != 0) {
    local_88 = (wasm *)&this->globalNames;
    sVar7 = 0;
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"global$","");
      NVar8 = makeName(&local_80,sVar7);
      name.super_IString.str._M_str = local_f0;
      name.super_IString.str._M_len = (size_t)NVar8.super_IString.str._M_str;
      getOrMakeName(&local_60,local_88,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(local_48 + sVar7),(Index)NVar8.super_IString.str._M_len,name,
                    in_stack_ffffffffffffff08);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_98 = (uintptr_t)getConcreteType(this);
      uVar2 = getU32LEB(this);
      if (1 < uVar2) {
        usedNames._M_h._M_single_bucket = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedNames._M_h._M_single_bucket,"Global mutability must be 0 or 1","")
        ;
        throwError(this,(string *)&usedNames._M_h._M_single_bucket);
      }
      local_90 = sVar7;
      pEVar4 = readExpression(this);
      pcVar5 = local_60.first.super_IString.str._M_str;
      sVar7 = local_60.first.super_IString.str._M_len;
      local_38._M_head_impl = (Global *)operator_new(0x50);
      (local_38._M_head_impl)->init = (Expression *)0x0;
      *(undefined8 *)&(local_38._M_head_impl)->mutable_ = 0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->type).id = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
           (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = sVar7;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = pcVar5
      ;
      ((local_38._M_head_impl)->type).id = local_98;
      (local_38._M_head_impl)->init = pEVar4;
      (local_38._M_head_impl)->mutable_ = uVar2 == 1;
      ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = local_60.second;
      Module::addGlobal(this->wasm,
                        (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_38);
      sVar7 = local_90;
      if (local_38._M_head_impl != (Global *)0x0) {
        operator_delete(local_38._M_head_impl,0x50);
      }
      sVar7 = sVar7 + 1;
    } while (local_40 != sVar7);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_f0);
  return;
}

Assistant:

void WasmBinaryReader::readGlobals() {
  size_t num = getU32LEB();
  auto numImports = wasm.globals.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : globalNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: global index out of bounds in name section: "
                << name << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    auto [name, isExplicit] = getOrMakeName(
      globalNames, numImports + i, makeName("global$", i), usedNames);
    auto type = getConcreteType();
    auto mutable_ = getU32LEB();
    if (mutable_ & ~1) {
      throwError("Global mutability must be 0 or 1");
    }
    auto* init = readExpression();
    auto global = Builder::makeGlobal(
      name, type, init, mutable_ ? Builder::Mutable : Builder::Immutable);
    global->hasExplicitName = isExplicit;
    wasm.addGlobal(std::move(global));
  }
}